

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O3

err_t g12sParamsStd(g12s_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  size_t count;
  octet *src;
  
  bVar1 = memIsValid(params,0x19c);
  if (bVar1 == 0) {
    return 0x6d;
  }
  memSet(params,'\0',0x19c);
  iVar2 = strCmp(name,"1.2.643.2.2.35.0");
  if (iVar2 == 0) {
    params->l = 0x100;
    memCopy(params->p,"1\x04",0x20);
    memCopy(params->a,"\a",1);
    memCopy(params->b,_a1_b,0x20);
    memCopy(params->q,_a1_q,0x20);
    params->n = 1;
    memCopy(params->xP,"\x02",1);
    memCopy(params->yP,_a1_yP,0x20);
    return 0;
  }
  iVar2 = strCmp(name,"1.2.643.2.2.35.1");
  if (iVar2 == 0) {
    params->l = 0x100;
    memCopy(params->p,_cryptoproA_p,0x20);
    memCopy(params->a,_cryptoproA_a,0x20);
    memCopy(params->b,_cryptoproA_b,1);
    memCopy(params->q,_cryptoproA_q,0x20);
    params->n = 1;
    memCopy(params->xP,"\x01",1);
    src = _cryptoproA_yP;
  }
  else {
    iVar2 = strCmp(name,"1.2.643.2.2.35.2");
    if (iVar2 == 0) {
      params->l = 0x100;
      memCopy(params->p,_cryptoproB_p,0x20);
      memCopy(params->a,_cryptoproB_a,0x20);
      memCopy(params->b,_cryptoproB_b,0x20);
      memCopy(params->q,_cryptoproB_q,0x20);
      params->n = 1;
      memCopy(params->xP,"\x01",1);
      src = _cryptoproB_yP;
    }
    else {
      iVar2 = strCmp(name,"1.2.643.2.2.35.3");
      if (iVar2 == 0) {
        params->l = 0x100;
        memCopy(params->p,_cryptoproC_p,0x20);
        memCopy(params->a,_cryptoproC_a,0x20);
        memCopy(params->b,_cryptoproC_b,2);
        memCopy(params->q,_cryptoproC_q,0x20);
        params->n = 1;
        memCopy(params->xP,"",1);
        src = _cryptoproC_yP;
      }
      else {
        iVar2 = strCmp(name,"1.2.643.2.9.1.8.1");
        if (iVar2 != 0) {
          iVar2 = strCmp(name,"1.2.643.7.1.2.1.2.0");
          if (iVar2 == 0) {
            params->l = 0x200;
            memCopy(params->p,_a2_p,0x40);
            memCopy(params->a,"\a",1);
            memCopy(params->b,_a2_b,0x40);
            memCopy(params->q,_a2_q,0x40);
            params->n = 1;
            memCopy(params->xP,_a2_xP,0x40);
            src = _a2_yP;
          }
          else {
            iVar2 = strCmp(name,"1.2.643.7.1.2.1.2.1");
            if (iVar2 == 0) {
              params->l = 0x200;
              memCopy(params->p,_paramsetA512_p,0x40);
              memCopy(params->a,_paramsetA512_a,0x40);
              memCopy(params->b,_paramsetA512_b,0x40);
              memCopy(params->q,_paramsetA512_q,0x40);
              params->n = 1;
              memCopy(params->xP,"\x03",1);
              src = _paramsetA512_yP;
            }
            else {
              iVar2 = strCmp(name,"1.2.643.7.1.2.1.2.2");
              if (iVar2 != 0) {
                return 0xca;
              }
              params->l = 0x200;
              memCopy(params->p,"o",0x40);
              memCopy(params->a,"l",0x40);
              memCopy(params->b,_paramsetB512_b,0x40);
              memCopy(params->q,_paramsetB512_q,0x40);
              params->n = 1;
              memCopy(params->xP,"\x02",1);
              src = _paramsetB512_yP;
            }
          }
          count = 0x40;
          goto LAB_00140fab;
        }
        params->l = 0x100;
        memCopy(params->p,_cryptocom_p,0x20);
        memCopy(params->a,_cryptocom_a,0x20);
        memCopy(params->b,_cryptocom_b,0x20);
        memCopy(params->q,_cryptocom_q,0x20);
        params->n = 2;
        memCopy(params->xP,"\x02",1);
        src = _cryptocom_yP;
      }
    }
  }
  count = 0x20;
LAB_00140fab:
  memCopy(params->yP,src,count);
  return 0;
}

Assistant:

err_t g12sParamsStd(g12s_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(g12s_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(g12s_params));
	if (strEq(name, _a1_name))
	{
		_LOAD_NAMED_PARAMS(params, a1);
		return ERR_OK;
	}
	if (strEq(name, _cryptoproA_name))
	{
		_LOAD_NAMED_PARAMS(params, cryptoproA);
		return ERR_OK;
	}
	if (strEq(name, _cryptoproB_name))
	{
		_LOAD_NAMED_PARAMS(params, cryptoproB);
		return ERR_OK;
	}
	if (strEq(name, _cryptoproC_name))
	{
		_LOAD_NAMED_PARAMS(params, cryptoproC);
		return ERR_OK;
	}
	if (strEq(name, _cryptocom_name))
	{
		_LOAD_NAMED_PARAMS(params, cryptocom);
		return ERR_OK;
	}
	if (strEq(name, _a2_name))
	{
		_LOAD_NAMED_PARAMS(params, a2);
		return ERR_OK;
	}
	if (strEq(name, _paramsetA512_name))
	{
		_LOAD_NAMED_PARAMS(params, paramsetA512);
		return ERR_OK;
	}
	if (strEq(name, _paramsetB512_name))
	{
		_LOAD_NAMED_PARAMS(params, paramsetB512);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}